

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall
DnsStats::SubmitCborRecords
          (DnsStats *this,cdns *cdns_ctx,cdns_query *query,cdns_query_signature *q_sig,
          cdns_qr_extended *ext,bool is_response)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  cdns_query_signature *pcVar5;
  undefined1 uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  pointer piVar11;
  int rrclass;
  cdns *pcVar12;
  long lVar13;
  undefined7 in_register_00000089;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  bool stored;
  int local_104;
  uint32_t e_length;
  uint32_t e_rcode;
  cdns_query_signature *local_f8;
  cdns *local_f0;
  cdns_query *local_e8;
  int local_dc;
  int local_d8;
  uint local_d4;
  DnsStats *local_d0;
  ulong local_c8;
  uint32_t *local_c0;
  uint32_t *local_b8;
  pointer local_b0;
  long local_a8;
  pointer local_a0;
  int x_i [4];
  
  local_104 = (int)CONCAT71(in_register_00000089,is_response);
  piVar9 = &q_sig->query_rcode;
  if (local_104 != 0) {
    piVar9 = &q_sig->response_rcode;
  }
  local_dc = *piVar9;
  e_rcode = 0;
  e_length = 0x200;
  uVar15 = 0xffffffff;
  local_f8 = q_sig;
  local_f0 = cdns_ctx;
  local_e8 = query;
  if (ext->is_filled == true) {
    x_i[0] = ext->question_index;
    x_i[1] = ext->answer_index;
    x_i[2] = ext->authority_index;
    x_i[3] = ext->additional_index;
    if (-1 < ext->question_index) {
      lVar10 = (long)q_sig->query_classtype_index - (long)cdns_ctx->index_offset;
      lVar13 = (long)query->query_name_index - (long)cdns_ctx->index_offset;
      pcVar2 = (cdns_ctx->block).tables.class_ids.
               super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (cdns_ctx->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start;
      SubmitQueryContent(this,pcVar2[lVar10].rr_type,pcVar2[lVar10].rr_class,pcVar3[lVar13].v,
                         (uint32_t)pcVar3[lVar13].l,0);
    }
    uVar15 = 0xffffffff;
    lVar10 = 1;
    local_c8 = (ulong)(byte)local_104;
    pcVar12 = local_f0;
    local_d0 = this;
    do {
      if (-1 < (long)x_i[lVar10]) {
        lVar13 = (long)x_i[lVar10] - (long)pcVar12->index_offset;
        pcVar4 = (pcVar12->block).tables.rr_list.
                 super__Vector_base<cdns_rr_list,_std::allocator<cdns_rr_list>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar11 = *(pointer *)
                   &pcVar4[lVar13].rr_index.super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if (*(pointer *)
             ((long)&pcVar4[lVar13].rr_index.super__Vector_base<int,_std::allocator<int>_>._M_impl +
             8) != piVar11) {
          local_b0 = pcVar4 + lVar13;
          local_b8 = (uint32_t *)0x0;
          if (lVar10 == 3) {
            local_b8 = &e_rcode;
          }
          local_c0 = (uint32_t *)0x0;
          if (lVar10 == 3) {
            local_c0 = &e_length;
          }
          uVar17 = 0;
          local_a8 = lVar10;
          do {
            lVar10 = (long)pcVar12->index_offset;
            lVar13 = piVar11[uVar17] - lVar10;
            pcVar2 = (pcVar12->block).tables.class_ids.
                     super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_a0 = (pcVar12->block).tables.rrs.
                       super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>._M_impl.
                       super__Vector_impl_data._M_start;
            lVar16 = local_a0[lVar13].classtype_index - lVar10;
            iVar8 = local_a0[lVar13].rdata_index;
            iVar1 = local_a0[lVar13].name_index;
            local_d4 = uVar15;
            if (pcVar2[lVar16].rr_type == 0x29) {
              local_d8 = local_f8->udp_buf_size;
              uVar7 = cdns::get_edns_flags(local_f8->qr_dns_flags);
              pcVar12 = local_f0;
              rrclass = local_d8;
              uVar15 = uVar7 | 0x8000;
              if (local_d0->dnssec_packet == (uint8_t *)0x0) {
                uVar15 = uVar7;
              }
            }
            else {
              rrclass = pcVar2[lVar16].rr_class;
              uVar15 = local_a0[lVar13].ttl;
            }
            this = local_d0;
            lVar14 = iVar8 - lVar10;
            lVar10 = iVar1 - lVar10;
            pcVar3 = (pcVar12->block).tables.name_rdata.
                     super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
                     super__Vector_impl_data._M_start;
            SubmitRecordContent(local_d0,(pcVar12->block).tables.class_ids.
                                         super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar16].rr_type,
                                rrclass,uVar15,(int)pcVar3[lVar14].l,pcVar3[lVar14].v,
                                pcVar3[lVar10].v,(uint32_t)pcVar3[lVar10].l,0,local_b8,local_c0,
                                SUB81(local_c8,0));
            uVar7 = local_d4;
            if ((int)local_d4 < 0) {
              uVar7 = local_a0[lVar13].name_index;
            }
            uVar15 = local_d4;
            if (local_a8 != 3) {
              uVar15 = uVar7;
            }
            uVar17 = uVar17 + 1;
            piVar11 = *(pointer *)
                       &(local_b0->rr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl;
            pcVar12 = local_f0;
            lVar10 = local_a8;
          } while (uVar17 < (ulong)((long)*(pointer *)
                                           ((long)&(local_b0->rr_index).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl + 8) - (long)piVar11 >> 2));
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  pcVar5 = local_f8;
  if ((byte)local_104 == '\0') {
    iVar8 = cdns::get_edns_flags(local_f8->qr_dns_flags);
    if (-1 < (long)pcVar5->opt_rdata_index) {
      lVar10 = (long)pcVar5->opt_rdata_index - (long)local_f0->index_offset;
      pcVar3 = (local_f0->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start;
      SubmitRecordContent(this,0x29,local_f8->udp_buf_size,iVar8,(int)pcVar3[lVar10].l,
                          pcVar3[lVar10].v,(uint8_t *)0x0,0,0,&e_rcode,&e_length,false);
    }
  }
  x_i[0] = 0;
  x_i[1] = 0;
  stored = false;
  x_i[2] = 0;
  x_i[3] = 4;
  BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,(DnsHashEntry *)x_i,true,&stored);
  if ((this->dnsstat_flags & 0x10) != 0) {
    if ((byte)local_104 == '\0') {
      x_i[0] = 0;
      x_i[1] = 0;
      stored = false;
      x_i[2] = 0;
      x_i[3] = 0x13;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,(DnsHashEntry *)x_i,true,&stored);
      lVar10 = 0x12;
    }
    else {
      x_i[0] = 0;
      x_i[1] = 0;
      stored = false;
      x_i[2] = 0;
      x_i[3] = 0x14;
      BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,(DnsHashEntry *)x_i,true,&stored);
      uVar7 = cdns::get_dns_flags(local_f8->qr_dns_flags,true);
      if ((uVar7 & 0x20) == 0) goto LAB_0015fb6a;
      lVar10 = 0x15;
    }
    x_i._8_8_ = lVar10 << 0x20;
    x_i[0] = 0;
    x_i[1] = 0;
    stored = false;
    BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,(DnsHashEntry *)x_i,true,&stored);
  }
LAB_0015fb6a:
  if ((byte)local_104 != '\0') {
    uVar6 = true;
    if (-1 < (int)uVar15) {
      lVar10 = (long)local_f0->index_offset;
      lVar13 = local_e8->query_name_index - lVar10;
      pcVar3 = (local_f0->block).tables.name_rdata.
               super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar3[lVar13].l != 0) {
        lVar16 = local_f8->query_classtype_index - lVar10;
        pcVar2 = (local_f0->block).tables.class_ids.
                 super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = false;
        if ((pcVar2[lVar16].rr_class == 1) && (uVar6 = false, pcVar2[lVar16].rr_type - 1U < 2)) {
          iVar8 = Compare2DnsNames(pcVar3[lVar13].v,(uint32_t)pcVar3[lVar13].l,0,
                                   pcVar3[(ulong)uVar15 - lVar10].v,
                                   (uint32_t)pcVar3[(ulong)uVar15 - lVar10].l,0);
          uVar6 = (undefined1)iVar8;
        }
      }
    }
    this->is_qname_minimized = (bool)uVar6;
  }
  return;
}

Assistant:

void DnsStats::SubmitCborRecords(cdns* cdns_ctx, cdns_query* query, cdns_query_signature* q_sig,
    cdns_qr_extended * ext, bool is_response)
{
    uint32_t rcode = (is_response) ? q_sig->response_rcode : q_sig->query_rcode;
    uint32_t e_rcode = 0;
    uint32_t e_length = 512;
    int first_rname_index = -1;


    if (ext->is_filled) {
        int x_i[4] = { ext->question_index, ext->answer_index, ext->authority_index, ext->additional_index };

        if (x_i[0] >= 0) {
            /* assume just one query per q_sig, but sometimes there is none. */
            size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
            size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
            SubmitQueryContent(cdns_ctx->block.tables.class_ids[cid].rr_type,
                cdns_ctx->block.tables.class_ids[cid].rr_class,
                cdns_ctx->block.tables.name_rdata[nid].v,
                (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0);
        }

        for (int i = 1; i < 4; i++) {
            if (x_i[i] >= 0) {
                cdns_rr_list* list = &cdns_ctx->block.tables.rr_list[(size_t)x_i[i]- cdns_ctx->index_offset];

                for (size_t j = 0; j < list->rr_index.size(); j++) {
                    cdns_rr_field * rr = &cdns_ctx->block.tables.rrs[(size_t)list->rr_index[j]- cdns_ctx->index_offset];
                    size_t cid = (size_t)rr->classtype_index - cdns_ctx->index_offset;
                    size_t rrid = (size_t) rr->rdata_index - cdns_ctx->index_offset;
                    size_t nid = (size_t)rr->name_index - cdns_ctx->index_offset;
                    int rr_class = cdns_ctx->block.tables.class_ids[cid].rr_class;
                    int ttl = rr->ttl;

                    if (cdns_ctx->block.tables.class_ids[cid].rr_type == DnsRtype_OPT) {
                        rr_class = q_sig->udp_buf_size;
                        ttl = cdns::get_edns_flags(q_sig->qr_dns_flags);

                        if (dnssec_packet != NULL) {
                            ttl |= (1 << 15);
                        }
                    }

                    SubmitRecordContent(
                        cdns_ctx->block.tables.class_ids[cid].rr_type, rr_class, ttl,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[rrid].l,
                        cdns_ctx->block.tables.name_rdata[rrid].v,
                        cdns_ctx->block.tables.name_rdata[nid].v,
                        (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l,
                        0, (i == 3) ? &e_rcode : NULL, (i == 3) ? &e_length : NULL, is_response);
                    if (first_rname_index < 0 && i < 3) {
                        first_rname_index = rr->name_index;
                    }
                }
            }
        }
    }

    if (!is_response) {
        int edns_flags = cdns::get_edns_flags(q_sig->qr_dns_flags);
        if (q_sig->opt_rdata_index >= 0) {
            size_t opt_rrid = (size_t)q_sig->opt_rdata_index - cdns_ctx->index_offset;

            SubmitRecordContent(DnsRtype_OPT, q_sig->udp_buf_size, edns_flags,
                (uint32_t)cdns_ctx->block.tables.name_rdata[opt_rrid].l,
                cdns_ctx->block.tables.name_rdata[opt_rrid].v,
                NULL, 0, 0, &e_rcode, &e_length, is_response);
        }
    }

    
    rcode |= (e_rcode << 4);
    SubmitRegistryNumber(REGISTRY_DNS_RCODES, rcode);

    if ((dnsstat_flags & dnsStateFlagCountPacketSizes) != 0)
    {
        if (is_response)
        {
            SubmitRegistryNumber(REGISTRY_DNS_Response_Size, query->response_size);
            if ((cdns::get_dns_flags(q_sig->qr_dns_flags,true) & (1 << 5)) != 0)
            {
                SubmitRegistryNumber(REGISTRY_DNS_TC_length, e_length);
            }
        }
        else
        {
            SubmitRegistryNumber(REGISTRY_DNS_Query_Size, query->query_size);
            SubmitRegistryNumber(REGISTRY_EDNS_Packet_Size, e_length);
        }
    }

    if (is_response) {
        size_t nid = (size_t)query->query_name_index - cdns_ctx->index_offset;
        if (first_rname_index >= 0) {
            if (cdns_ctx->block.tables.name_rdata[nid].l == 0) {
                is_qname_minimized = true;
            }
            else {
                size_t cid = (size_t)q_sig->query_classtype_index - cdns_ctx->index_offset;
                size_t rname_id = (size_t)first_rname_index - cdns_ctx->index_offset;

                is_qname_minimized = IsQNameMinimized(
                    1,
                    cdns_ctx->block.tables.class_ids[cid].rr_class,
                    cdns_ctx->block.tables.class_ids[cid].rr_type,
                    cdns_ctx->block.tables.name_rdata[nid].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[nid].l, 0,
                    cdns_ctx->block.tables.name_rdata[rname_id].v,
                    (uint32_t)cdns_ctx->block.tables.name_rdata[rname_id].l, 0);
            }
        }
        else {
            /* In the absence of further knowledge, assume that this is true. */
            is_qname_minimized = true;
        }
    }
}